

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lj_debug_funcname(lua_State *L,cTValue *frame,char **name)

{
  BCPos slot_00;
  uint uVar1;
  GCfunc *fn_00;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  long *in_RDX;
  cTValue *in_RSI;
  lua_State *in_RDI;
  BCReg slot;
  MMS mm;
  BCIns *ip;
  GCproto *pt;
  BCPos pc;
  GCfunc *fn;
  cTValue *pframe;
  GCproto *local_58;
  cTValue *local_18;
  char *local_8;
  
  if (in_RSI <= (cTValue *)(ulong)(in_RDI->stack).ptr32) {
    return (char *)0x0;
  }
  local_18 = in_RSI;
  if (((in_RSI->field_2).it & 7) == 3) {
    local_18 = (cTValue *)((long)in_RSI - ((long)(int)(in_RSI->field_2).it & 0xfffffffffffffff8U));
  }
  if (((local_18->field_2).it & 3) == 0) {
    lVar4 = (ulong)((*(uint *)((ulong)(local_18->field_2).it - 4) >> 8 & 0xff) + 1) * -8;
  }
  else {
    lVar4 = -((long)(int)(local_18->field_2).it & 0xfffffffffffffff8U);
  }
  local_58 = (GCproto *)((long)local_18 + lVar4);
  fn_00 = (GCfunc *)(ulong)(local_58->nextgc).gcptr32;
  slot_00 = debug_framepc(in_RDI,fn_00,local_18);
  if (slot_00 != 0xffffffff) {
    uVar2 = (ulong)(fn_00->c).pc.ptr32;
    uVar1 = (int)(uint)lj_bc_mode[*(uint *)(uVar2 + (ulong)slot_00 * 4) & 0xff] >> 0xb;
    if (uVar1 == 9) {
      pcVar3 = lj_debug_slotname(local_58,(BCIns *)fn_00,slot_00,(char **)(uVar2 - 0x40));
      return pcVar3;
    }
    if (uVar1 != 0x16) {
      *in_RDX = (ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x198 + (ulong)uVar1 * 4) + 0x10;
      local_8 = "metamethod";
      return local_8;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_funcname(lua_State *L, cTValue *frame, const char **name)
{
  cTValue *pframe;
  GCfunc *fn;
  BCPos pc;
  if (frame <= tvref(L->stack)+LJ_FR2)
    return NULL;
  if (frame_isvarg(frame))
    frame = frame_prevd(frame);
  pframe = frame_prev(frame);
  fn = frame_func(pframe);
  pc = debug_framepc(L, fn, frame);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    const BCIns *ip = &proto_bc(pt)[check_exp(pc < pt->sizebc, pc)];
    MMS mm = bcmode_mm(bc_op(*ip));
    if (mm == MM_call) {
      BCReg slot = bc_a(*ip);
      if (bc_op(*ip) == BC_ITERC) slot -= 3;
      return lj_debug_slotname(pt, ip, slot, name);
    } else if (mm != MM__MAX) {
      *name = strdata(mmname_str(G(L), mm));
      return "metamethod";
    }
  }
  return NULL;
}